

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::finished(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  pointer pIVar1;
  longlong lVar2;
  longlong _t2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  optional<long_long> oVar4;
  QByteArrayView value;
  undefined1 local_40 [16];
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (1 < this->state - Finished) {
    this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    this->notificationHandlingPaused = true;
    local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)local_40);
    QVar3 = QHttpHeaders::value((QHttpHeaders *)local_40,ContentLength,(QByteArrayView)ZEXT816(0));
    value.m_data = QVar3.m_data;
    value.m_size = (qsizetype)value.m_data;
    oVar4 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar3.m_size,value);
    local_40._8_8_ =
         oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>._M_payload;
    puStack_30 = (undefined1 *)
                 CONCAT71(puStack_30._1_7_,
                          oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
                          super__Optional_payload_base<long_long>._M_engaged);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_40);
    local_40._0_4_ = -1;
    lVar2 = std::optional<long_long>::value_or<int>
                      ((optional<long_long> *)(local_40 + 8),(int *)local_40);
    resumeNotificationHandling(this);
    this->state = Finished;
    QNetworkReply::setFinished(this_00,true);
    pIVar1 = (this->pendingNotifications).
             super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pendingNotifications).
        super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
      (this->pendingNotifications).
      super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
    }
    this->notificationHandlingPaused = true;
    _t2 = lVar2;
    if (lVar2 == -1) {
      _t2 = this->bytesDownloaded;
    }
    QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,_t2);
    if ((this->bytesUploaded == -1) &&
       ((this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0 || this->outgoingData != (QIODevice *)0x0)) {
      QNetworkReply::uploadProgress(this_00,0,0);
    }
    resumeNotificationHandling(this);
    if ((lVar2 == -1) || (this->bytesDownloaded == lVar2)) {
      completeCacheSave(this);
    }
    this->notificationHandlingPaused = true;
    QIODevice::readChannelFinished();
    QNetworkReply::finished(this_00);
    resumeNotificationHandling(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::finished()
{
    Q_Q(QNetworkReplyImpl);

    if (state == Finished || state == Aborted)
        return;

    pauseNotificationHandling();
    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
    const auto totalSize = totalSizeOpt.value_or(-1);

    resumeNotificationHandling();

    state = Finished;
    q->setFinished(true);

    pendingNotifications.clear();

    pauseNotificationHandling();
    if (totalSize == -1) {
        emit q->downloadProgress(bytesDownloaded, bytesDownloaded);
    } else {
        emit q->downloadProgress(bytesDownloaded, totalSize);
    }

    if (bytesUploaded == -1 && (outgoingData || outgoingDataBuffer))
        emit q->uploadProgress(0, 0);
    resumeNotificationHandling();

    // if we don't know the total size of or we received everything save the cache
    if (totalSize == -1 || bytesDownloaded == totalSize)
        completeCacheSave();

    // note: might not be a good idea, since users could decide to delete us
    // which would delete the backend too...
    // maybe we should protect the backend
    pauseNotificationHandling();
    emit q->readChannelFinished();
    emit q->finished();
    resumeNotificationHandling();
}